

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::internal::MemoryBuffer<char,_50UL,_std::allocator<char>_>::grow
          (MemoryBuffer<char,_50UL,_std::allocator<char>_> *this,size_t size)

{
  char *__src;
  size_t __n;
  ulong uVar1;
  char *__dest;
  ulong uVar2;
  
  uVar2 = (this->super_Buffer<char>).capacity_;
  uVar2 = (uVar2 >> 1) + uVar2;
  if (uVar2 <= size) {
    uVar2 = size;
  }
  if ((long)uVar2 < 0) {
    std::__throw_bad_alloc();
  }
  __dest = (char *)operator_new(uVar2);
  __src = (this->super_Buffer<char>).ptr_;
  __n = (this->super_Buffer<char>).size_;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  uVar1 = (this->super_Buffer<char>).capacity_;
  (this->super_Buffer<char>).capacity_ = uVar2;
  (this->super_Buffer<char>).ptr_ = __dest;
  if (__src != this->data_) {
    operator_delete(__src,uVar1);
    return;
  }
  return;
}

Assistant:

void MemoryBuffer<T, SIZE, Allocator>::grow(std::size_t size) {
  std::size_t new_capacity = this->capacity_ + this->capacity_ / 2;
  if (size > new_capacity)
      new_capacity = size;
  T *new_ptr = this->allocate(new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(this->ptr_, this->ptr_ + this->size_,
                          make_ptr(new_ptr, new_capacity));
  std::size_t old_capacity = this->capacity_;
  T *old_ptr = this->ptr_;
  this->capacity_ = new_capacity;
  this->ptr_ = new_ptr;
  // deallocate may throw (at least in principle), but it doesn't matter since
  // the buffer already uses the new storage and will deallocate it in case
  // of exception.
  if (old_ptr != data_)
    Allocator::deallocate(old_ptr, old_capacity);
}